

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

GLuint __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::genStorage
          (InterCallTestCase *this,int friendlyName)

{
  pointer *ppuVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined8 uVar5;
  char *pcVar6;
  int iVar7;
  allocator_type local_1c1;
  GLuint retVal;
  value_type_conflict4 local_1bc;
  size_type local_1b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroBuffer;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if (this->m_storage == STORAGE_IMAGE) {
    iVar2 = this->m_invocationGridSize;
    iVar7 = this->m_perInvocationSize * iVar2;
    retVal = 0;
    zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppuVar1 = &zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
    std::operator<<((ostream *)ppuVar1,"Creating image #");
    std::ostream::operator<<(ppuVar1,friendlyName);
    std::operator<<((ostream *)ppuVar1,", size ");
    std::ostream::operator<<(ppuVar1,iVar2);
    std::operator<<((ostream *)ppuVar1,"x");
    std::ostream::operator<<(ppuVar1,iVar7);
    std::operator<<((ostream *)ppuVar1,", internalformat = ");
    pcVar6 = "r32f";
    if (this->m_formatInteger != false) {
      pcVar6 = "r32i";
    }
    std::operator<<((ostream *)ppuVar1,pcVar6);
    std::operator<<((ostream *)ppuVar1,", size = ");
    local_1b8 = (size_type)(iVar7 * iVar2);
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
    std::operator<<((ostream *)ppuVar1," bytes.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&zeroBuffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
    (**(code **)(lVar4 + 0x6f8))(1,&retVal);
    (**(code **)(lVar4 + 0xb8))(0xde1,retVal);
    uVar5 = 0x822e;
    if (this->m_formatInteger != false) {
      uVar5 = 0x8235;
    }
    (**(code **)(lVar4 + 0x1380))(0xde1,1,uVar5,iVar2,iVar7);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2801,0x2600);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2800,0x2600);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"gen image",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x69d);
    zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppuVar1 = &zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
    std::operator<<((ostream *)ppuVar1,"Filling image with 0");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&zeroBuffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
    if (this->m_formatInteger == true) {
      local_1bc = 0.0;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&zeroBuffer,local_1b8,
                 (value_type_conflict1 *)&local_1bc,(allocator_type *)&local_1c1);
      (**(code **)(lVar4 + 0x13b8))
                (0xde1,0,0,0,iVar2,iVar7,0x8d94,0x1404,
                 zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&zeroBuffer);
    }
    else {
      local_1bc = 0.0;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&zeroBuffer,local_1b8,&local_1bc,
                 (allocator_type *)&local_1c1);
      (**(code **)(lVar4 + 0x13b8))
                (0xde1,0,0,0,iVar2,iVar7,0x1903,0x1406,
                 zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&zeroBuffer);
    }
    dVar3 = (**(code **)(lVar4 + 0x800))();
    pcVar6 = "specify image contents";
    iVar2 = 0x6af;
  }
  else {
    if (this->m_storage != STORAGE_BUFFER) {
      return 0;
    }
    iVar7 = this->m_invocationGridSize * this->m_invocationGridSize * this->m_perInvocationSize;
    retVal = 0;
    zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppuVar1 = &zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
    std::operator<<((ostream *)ppuVar1,"Creating buffer #");
    std::ostream::operator<<(ppuVar1,friendlyName);
    std::operator<<((ostream *)ppuVar1,", size ");
    iVar2 = iVar7 * 4;
    std::ostream::operator<<(ppuVar1,iVar2);
    std::operator<<((ostream *)ppuVar1," bytes.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&zeroBuffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
    (**(code **)(lVar4 + 0x6c8))(1,&retVal);
    (**(code **)(lVar4 + 0x40))(0x90d2,retVal);
    if (this->m_formatInteger == true) {
      local_1bc = 0.0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&zeroBuffer,(long)iVar7,(value_type_conflict2 *)&local_1bc,&local_1c1);
      (**(code **)(lVar4 + 0x150))
                (0x90d2,(long)iVar2,
                 zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88e4);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    else {
      local_1bc = 0.0;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&zeroBuffer,(long)iVar7,&local_1bc,
                 (allocator_type *)&local_1c1);
      (**(code **)(lVar4 + 0x150))
                (0x90d2,(long)iVar2,
                 zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88e4);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&zeroBuffer);
    }
    dVar3 = (**(code **)(lVar4 + 0x800))();
    pcVar6 = "gen buffer";
    iVar2 = 0x682;
  }
  glu::checkError(dVar3,pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,iVar2);
  return retVal;
}

Assistant:

glw::GLuint InterCallTestCase::genStorage (int friendlyName)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_storage == STORAGE_BUFFER)
	{
		const int		numElements		= m_invocationGridSize * m_invocationGridSize * m_perInvocationSize;
		const int		bufferSize		= numElements * (int)((m_formatInteger) ? (sizeof(deInt32)) : (sizeof(glw::GLfloat)));
		glw::GLuint		retVal			= 0;

		m_testCtx.getLog() << tcu::TestLog::Message << "Creating buffer #" << friendlyName << ", size " << bufferSize << " bytes." << tcu::TestLog::EndMessage;

		gl.genBuffers(1, &retVal);
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, retVal);

		if (m_formatInteger)
		{
			const std::vector<deUint32> zeroBuffer(numElements, 0);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, &zeroBuffer[0], GL_STATIC_DRAW);
		}
		else
		{
			const std::vector<float> zeroBuffer(numElements, 0.0f);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, &zeroBuffer[0], GL_STATIC_DRAW);
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffer");

		return retVal;
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		const int	imageWidth	= m_invocationGridSize;
		const int	imageHeight	= m_invocationGridSize * m_perInvocationSize;
		glw::GLuint	retVal		= 0;

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Creating image #" << friendlyName << ", size " << imageWidth << "x" << imageHeight
			<< ", internalformat = " << ((m_formatInteger) ? ("r32i") : ("r32f"))
			<< ", size = " << (imageWidth*imageHeight*sizeof(deUint32)) << " bytes."
			<< tcu::TestLog::EndMessage;

		gl.genTextures(1, &retVal);
		gl.bindTexture(GL_TEXTURE_2D, retVal);

		if (m_formatInteger)
			gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32I, imageWidth, imageHeight);
		else
			gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32F, imageWidth, imageHeight);

		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen image");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Filling image with 0"
			<< tcu::TestLog::EndMessage;

		if (m_formatInteger)
		{
			const std::vector<deInt32> zeroBuffer(imageWidth * imageHeight, 0);
			gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, imageWidth, imageHeight, GL_RED_INTEGER, GL_INT, &zeroBuffer[0]);
		}
		else
		{
			const std::vector<float> zeroBuffer(imageWidth * imageHeight, 0.0f);
			gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, imageWidth, imageHeight, GL_RED, GL_FLOAT, &zeroBuffer[0]);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "specify image contents");

		return retVal;
	}
	else
	{
		DE_ASSERT(DE_FALSE);
		return 0;
	}
}